

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

void __thiscall TURBOLINECOUNT::CLineCount::CLineCount(CLineCount *this,PARAMETERS *parameters)

{
  long lVar1;
  long lVar2;
  int iVar3;
  PARAMETERS *ctx;
  int allocationgranularity;
  int cpucount;
  PARAMETERS *parameters_local;
  CLineCount *this_local;
  
  ctx = parameters;
  std::__cxx11::string::string((string *)&this->m_lasterrorstring);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_threads);
  std::vector<long,_std::allocator<long>_>::vector(&this->m_threadlinecounts);
  lVar1 = sysconf(0x54);
  lVar2 = sysconf(0x1e);
  iVar3 = (int)lVar2;
  (this->m_parameters).threadcount = (int)lVar1;
  (this->m_parameters).buffersize = 0x100000;
  if (parameters != (PARAMETERS *)0x0) {
    if (parameters->buffersize != 0xffffffffffffffff) {
      (this->m_parameters).buffersize = parameters->buffersize;
      (this->m_parameters).buffersize =
           ((long)iVar3 - (this->m_parameters).buffersize % (ulong)(long)iVar3) % (ulong)(long)iVar3
           + (this->m_parameters).buffersize;
    }
    if (parameters->threadcount != -1) {
      (this->m_parameters).threadcount = parameters->threadcount;
    }
  }
  init(this,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

CLineCount::CLineCount(PARAMETERS *parameters)
{

	// Set line count parameter defaults
	int cpucount;
	int allocationgranularity;
#if defined(_WIN32) || defined(__cygwin__) || defined(__MIN)
	SYSTEM_INFO sysinfo;
	GetSystemInfo(&sysinfo);
	cpucount = sysinfo.dwNumberOfProcessors;
	allocationgranularity = sysinfo.dwAllocationGranularity;
//#elif defined(__linux__)
#elif TLC_COMPATIBLE_UNIX
	cpucount = sysconf(_SC_NPROCESSORS_ONLN);
	allocationgranularity = sysconf(_SC_PAGESIZE);
//#elif (defined (__APPLE__) && defined (__MACH__))
//	mmsize_t count_len = sizeof(cpucount);
//	sysctlbyname("hw.logicalcpu", &cpucount, &count_len, NULL, 0);
//#else
//	cpucount = 1;
#endif
	m_parameters.threadcount = cpucount;
	m_parameters.buffersize = (1024 * 1024);
	
	// Override defaults if specified
	if (parameters)
	{
		if (parameters->buffersize != -1)
		{
			m_parameters.buffersize = parameters->buffersize;
			m_parameters.buffersize += (allocationgranularity - (m_parameters.buffersize % allocationgranularity)) % allocationgranularity;
		}
		if (parameters->threadcount != -1)
		{
			m_parameters.threadcount = parameters->threadcount;
		}
	}
	
	init();
}